

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_MapEntryPartialTest_Test::TestBody
          (ComparisonTest_MapEntryPartialTest_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  string local_b30;
  AssertHelper local_b10;
  Message local_b08;
  bool local_af9;
  undefined1 local_af8 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_ac8;
  Message local_ac0;
  string_view local_ab8;
  bool local_aa1;
  undefined1 local_aa0 [8];
  AssertionResult gtest_ar__3;
  Message local_a88;
  undefined1 local_a80 [8];
  AssertionResult gtest_ar;
  AssertHelper local_a50;
  Message local_a48;
  bool local_a39;
  undefined1 local_a38 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_a08;
  Message local_a00;
  string_view local_9f8;
  bool local_9e1;
  undefined1 local_9e0 [8];
  AssertionResult gtest_ar__1;
  string local_9c8;
  AssertHelper local_9a8;
  Message local_9a0;
  string_view local_998;
  bool local_981;
  undefined1 local_980 [8];
  AssertionResult gtest_ar_;
  MessageDifferencer differencer;
  string output;
  TestMap map2;
  undefined1 local_3e8 [8];
  TestMap map1;
  Parser parser;
  ComparisonTest_MapEntryPartialTest_Test *this_local;
  
  TextFormat::Parser::Parser((Parser *)&map1.field_0._impl_._cached_size_);
  proto2_unittest::TestMap::TestMap((TestMap *)local_3e8);
  proto2_unittest::TestMap::TestMap((TestMap *)((long)&output.field_2 + 8));
  std::__cxx11::string::string((string *)&differencer.unpack_any_field_);
  util::MessageDifferencer::MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  util::MessageDifferencer::set_scope((MessageDifferencer *)&gtest_ar_.message_,PARTIAL);
  util::MessageDifferencer::ReportDifferencesToString
            ((MessageDifferencer *)&gtest_ar_.message_,(string *)&differencer.unpack_any_field_);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_998,"map_int32_foreign_message { key: 1 value { c: 1 } }");
  local_981 = TextFormat::Parser::ParseFromString
                        ((Parser *)&map1.field_0._impl_._cached_size_,local_998,(Message *)local_3e8
                        );
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_980,&local_981,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_980);
  if (!bVar1) {
    testing::Message::Message(&local_9a0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_9c8,(internal *)local_980,
               (AssertionResult *)
               "parser.ParseFromString( \"map_int32_foreign_message { key: 1 value { c: 1 } }\", &map1)"
               ,"false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_9a8,kFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0xf1d,pcVar2);
    testing::internal::AssertHelper::operator=(&local_9a8,&local_9a0);
    testing::internal::AssertHelper::~AssertHelper(&local_9a8);
    std::__cxx11::string::~string((string *)&local_9c8);
    testing::Message::~Message(&local_9a0);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_980);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_9f8,"map_int32_foreign_message { key: 1 value { c: 2 }}");
    local_9e1 = TextFormat::Parser::ParseFromString
                          ((Parser *)&map1.field_0._impl_._cached_size_,local_9f8,
                           (Message *)((long)&output.field_2 + 8));
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_9e0,&local_9e1,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_9e0);
    if (!bVar1) {
      testing::Message::Message(&local_a00);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar__2.message_,(internal *)local_9e0,
                 (AssertionResult *)
                 "parser.ParseFromString( \"map_int32_foreign_message { key: 1 value { c: 2 }}\", &map2)"
                 ,"false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_a08,kFatalFailure,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                 ,0xf1f,pcVar2);
      testing::internal::AssertHelper::operator=(&local_a08,&local_a00);
      testing::internal::AssertHelper::~AssertHelper(&local_a08);
      std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
      testing::Message::~Message(&local_a00);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_9e0);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      bVar1 = util::MessageDifferencer::Compare
                        ((MessageDifferencer *)&gtest_ar_.message_,(Message *)local_3e8,
                         (Message *)((long)&output.field_2 + 8));
      local_a39 = (bool)(~bVar1 & 1);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_a38,&local_a39,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a38);
      if (!bVar1) {
        testing::Message::Message(&local_a48);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar.message_,(internal *)local_a38,
                   (AssertionResult *)"differencer.Compare(map1, map2)","true","false",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_a50,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                   ,0xf20,pcVar2);
        testing::internal::AssertHelper::operator=(&local_a50,&local_a48);
        testing::internal::AssertHelper::~AssertHelper(&local_a50);
        std::__cxx11::string::~string((string *)&gtest_ar.message_);
        testing::Message::~Message(&local_a48);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a38);
      testing::internal::EqHelper::
      Compare<char[50],_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_nullptr>
                ((EqHelper *)local_a80,"\"modified: map_int32_foreign_message[1].c: 1 -> 2\\n\"",
                 "output",(char (*) [50])"modified: map_int32_foreign_message[1].c: 1 -> 2\n",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &differencer.unpack_any_field_);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a80);
      if (!bVar1) {
        testing::Message::Message(&local_a88);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a80);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar__3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                   ,0xf21,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__3.message_,&local_a88)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_a88);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_a80);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_ab8,"map_int32_foreign_message { key: 1 }");
      local_aa1 = TextFormat::Parser::ParseFromString
                            ((Parser *)&map1.field_0._impl_._cached_size_,local_ab8,
                             (Message *)local_3e8);
      testing::AssertionResult::AssertionResult<bool>
                ((AssertionResult *)local_aa0,&local_aa1,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_aa0);
      if (!bVar1) {
        testing::Message::Message(&local_ac0);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__4.message_,(internal *)local_aa0,
                   (AssertionResult *)
                   "parser.ParseFromString(\"map_int32_foreign_message { key: 1 }\", &map1)","false"
                   ,"true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_ac8,kFatalFailure,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                   ,0xf24,pcVar2);
        testing::internal::AssertHelper::operator=(&local_ac8,&local_ac0);
        testing::internal::AssertHelper::~AssertHelper(&local_ac8);
        std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
        testing::Message::~Message(&local_ac0);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_aa0);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_af9 = util::MessageDifferencer::Compare
                              ((MessageDifferencer *)&gtest_ar_.message_,(Message *)local_3e8,
                               (Message *)((long)&output.field_2 + 8));
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_af8,&local_af9,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_af8);
        if (!bVar1) {
          testing::Message::Message(&local_b08);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_b30,(internal *)local_af8,
                     (AssertionResult *)"differencer.Compare(map1, map2)","false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_b10,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
                     ,0xf25,pcVar2);
          testing::internal::AssertHelper::operator=(&local_b10,&local_b08);
          testing::internal::AssertHelper::~AssertHelper(&local_b10);
          std::__cxx11::string::~string((string *)&local_b30);
          testing::Message::~Message(&local_b08);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_af8);
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ = 0;
      }
    }
  }
  util::MessageDifferencer::~MessageDifferencer((MessageDifferencer *)&gtest_ar_.message_);
  std::__cxx11::string::~string((string *)&differencer.unpack_any_field_);
  proto2_unittest::TestMap::~TestMap((TestMap *)((long)&output.field_2 + 8));
  proto2_unittest::TestMap::~TestMap((TestMap *)local_3e8);
  TextFormat::Parser::~Parser((Parser *)&map1.field_0._impl_._cached_size_);
  return;
}

Assistant:

TEST_F(ComparisonTest, MapEntryPartialTest) {
  TextFormat::Parser parser;
  unittest::TestMap map1;
  unittest::TestMap map2;

  std::string output;
  util::MessageDifferencer differencer;
  differencer.set_scope(util::MessageDifferencer::PARTIAL);
  differencer.ReportDifferencesToString(&output);

  ASSERT_TRUE(parser.ParseFromString(
      "map_int32_foreign_message { key: 1 value { c: 1 } }", &map1));
  ASSERT_TRUE(parser.ParseFromString(
      "map_int32_foreign_message { key: 1 value { c: 2 }}", &map2));
  EXPECT_FALSE(differencer.Compare(map1, map2));
  EXPECT_EQ("modified: map_int32_foreign_message[1].c: 1 -> 2\n", output);

  ASSERT_TRUE(
      parser.ParseFromString("map_int32_foreign_message { key: 1 }", &map1));
  EXPECT_TRUE(differencer.Compare(map1, map2));
}